

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

bool qt_PersistentModelIndexLessThan(QPersistentModelIndex *i1,QPersistentModelIndex *i2)

{
  long lVar1;
  bool bVar2;
  QPersistentModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex parent2;
  QModelIndex parent1;
  QModelIndex *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPersistentModelIndex::parent(in_RDI);
  QPersistentModelIndex::parent(in_RDI);
  bVar2 = operator==((QModelIndex *)
                     CONCAT17(in_stack_ffffffffffffffb7,
                              CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                     in_stack_ffffffffffffffa8);
  if (bVar2) {
    bVar2 = operator<((QPersistentModelIndex *)
                      CONCAT17(in_stack_ffffffffffffffb7,
                               CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                      (QPersistentModelIndex *)in_stack_ffffffffffffffa8);
  }
  else {
    bVar2 = operator<((QModelIndex *)
                      CONCAT17(in_stack_ffffffffffffffb7,
                               CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                      in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool qt_PersistentModelIndexLessThan(const QPersistentModelIndex &i1, const QPersistentModelIndex &i2)
{
    const QModelIndex parent1 = i1.parent();
    const QModelIndex parent2 = i2.parent();
    return parent1 == parent2 ? i1 < i2 : parent1 < parent2;
}